

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void warn_equality_value(lyxp_expr *exp,lyxp_set *set,uint32_t val_exp,uint32_t equal_exp,
                        uint32_t last_equal_exp)

{
  ly_ctx *plVar1;
  ulong uVar2;
  int iVar3;
  lysc_node *plVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  char *pcVar8;
  lysc_node *plVar9;
  ly_err_item *err;
  ulong local_70;
  ulong local_68;
  lys_module *local_60;
  lyd_value storage;
  
  uVar2 = (ulong)last_equal_exp;
  err = (ly_err_item *)0x0;
  plVar4 = warn_get_scnode_in_ctx(set);
  if (plVar4 == (lysc_node *)0x0) {
    return;
  }
  if ((plVar4->nodetype & 0xc) == 0) {
    return;
  }
  if (1 < exp->tokens[val_exp] - LYXP_TOKEN_LITERAL) {
    return;
  }
  pcVar8 = exp->expr + exp->tok_pos[val_exp];
  if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
    pcVar8 = pcVar8 + 1;
    uVar7 = exp->tok_len[val_exp] - 2;
  }
  else {
    uVar7 = exp->tok_len[val_exp];
  }
  pcVar8 = strndup(pcVar8,(ulong)uVar7);
  if (pcVar8 == (char *)0x0) {
    ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","warn_equality_value");
    return;
  }
  plVar9 = plVar4[1].parent;
  local_70 = (ulong)equal_exp;
  if (*(int *)&plVar9->next == 0xc) {
    pcVar5 = strchr(pcVar8,0x3a);
    if (pcVar5 != (char *)0x0) goto LAB_0019f80f;
    ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
           "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding a prefix or best using \"derived-from(-or-self)()\" functions."
           ,plVar4->name,pcVar8);
    uVar7 = exp->tok_pos[local_70];
    warn_subexpr_log(set->ctx,uVar7,exp->expr + uVar7,
                     (exp->tok_pos[uVar2] - uVar7) + exp->tok_len[uVar2],(set->field_10).cur_scnode)
    ;
    plVar9 = plVar4[1].parent;
    if (*(int *)&plVar9->next == 0xc) goto LAB_0019f80f;
  }
  local_60 = plVar9->parent->module;
  plVar1 = set->ctx;
  local_68 = uVar2;
  sVar6 = strlen(pcVar8);
  iVar3 = (*(code *)local_60)(plVar1,plVar9,pcVar8,sVar6,0,set->format,set->prefix_data,0x3f3,plVar4
                              ,&storage,0,&err);
  if (iVar3 == 9) {
    iVar3 = 0;
  }
  if (err == (ly_err_item *)0x0) {
    if (iVar3 == 0) goto LAB_0019f7fc;
    ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,"Invalid value \"%s\" which does not fit the type.",pcVar8);
  }
  else {
    ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,"Invalid value \"%s\" which does not fit the type (%s).",
           pcVar8,err->msg);
    ly_err_free(err);
    if (iVar3 == 0) {
LAB_0019f7fc:
      (*(code *)plVar9->parent->ref)(set->ctx,&storage);
      goto LAB_0019f80f;
    }
  }
  uVar7 = exp->tok_pos[local_70];
  warn_subexpr_log(set->ctx,uVar7,exp->expr + uVar7,
                   (exp->tok_pos[local_68] - uVar7) + exp->tok_len[local_68],
                   (set->field_10).cur_scnode);
LAB_0019f80f:
  free(pcVar8);
  return;
}

Assistant:

static void
warn_equality_value(const struct lyxp_expr *exp, struct lyxp_set *set, uint32_t val_exp, uint32_t equal_exp,
        uint32_t last_equal_exp)
{
    struct lysc_node *scnode;
    struct lysc_type *type;
    char *value;
    struct lyd_value storage;
    LY_ERR rc;
    struct ly_err_item *err = NULL;

    if ((scnode = warn_get_scnode_in_ctx(set)) && (scnode->nodetype & (LYS_LEAF | LYS_LEAFLIST)) &&
            ((exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) || (exp->tokens[val_exp] == LYXP_TOKEN_NUMBER))) {
        /* check that the node can have the specified value */
        if (exp->tokens[val_exp] == LYXP_TOKEN_LITERAL) {
            value = strndup(exp->expr + exp->tok_pos[val_exp] + 1, exp->tok_len[val_exp] - 2);
        } else {
            value = strndup(exp->expr + exp->tok_pos[val_exp], exp->tok_len[val_exp]);
        }
        if (!value) {
            LOGMEM(set->ctx);
            return;
        }

        if ((((struct lysc_node_leaf *)scnode)->type->basetype == LY_TYPE_IDENT) && !strchr(value, ':')) {
            LOGWRN(set->ctx, "Identityref \"%s\" comparison with identity \"%s\" without prefix, consider adding"
                    " a prefix or best using \"derived-from(-or-self)()\" functions.", scnode->name, value);
            warn_subexpr_log(set->ctx, exp->tok_pos[equal_exp], exp->expr + exp->tok_pos[equal_exp],
                    (exp->tok_pos[last_equal_exp] - exp->tok_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                    set->cur_scnode);
        }

        type = ((struct lysc_node_leaf *)scnode)->type;
        if (type->basetype != LY_TYPE_IDENT) {
            rc = type->plugin->store(set->ctx, type, value, strlen(value), 0, set->format, set->prefix_data,
                    LYD_HINT_DATA, scnode, &storage, NULL, &err);
            if (rc == LY_EINCOMPLETE) {
                rc = LY_SUCCESS;
            }

            if (err) {
                LOGWRN(set->ctx, "Invalid value \"%s\" which does not fit the type (%s).", value, err->msg);
                ly_err_free(err);
            } else if (rc != LY_SUCCESS) {
                LOGWRN(set->ctx, "Invalid value \"%s\" which does not fit the type.", value);
            }
            if (rc != LY_SUCCESS) {
                warn_subexpr_log(set->ctx, exp->tok_pos[equal_exp], exp->expr + exp->tok_pos[equal_exp],
                        (exp->tok_pos[last_equal_exp] - exp->tok_pos[equal_exp]) + exp->tok_len[last_equal_exp],
                        set->cur_scnode);
            } else {
                type->plugin->free(set->ctx, &storage);
            }
        }
        free(value);
    }
}